

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hmm.cpp
# Opt level: O2

void __thiscall
hmm::hmm(hmm *this,
        unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
        *switchRate,string *code1,string *qual1,string *code2,string *qual2,int minGCPositions)

{
  (this->switchRateMap)._M_h._M_buckets = &(this->switchRateMap)._M_h._M_single_bucket;
  (this->switchRateMap)._M_h._M_bucket_count = 1;
  (this->switchRateMap)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->switchRateMap)._M_h._M_element_count = 0;
  (this->switchRateMap)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->switchRateMap)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->switchRateMap)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->distanceMap)._M_h._M_buckets = &(this->distanceMap)._M_h._M_single_bucket;
  (this->distanceMap)._M_h._M_bucket_count = 1;
  (this->distanceMap)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->distanceMap)._M_h._M_element_count = 0;
  (this->distanceMap)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->distanceMap)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->distanceMap)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->qualityMap1)._M_h._M_buckets = &(this->qualityMap1)._M_h._M_single_bucket;
  (this->qualityMap1)._M_h._M_bucket_count = 1;
  (this->qualityMap1)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->qualityMap1)._M_h._M_element_count = 0;
  (this->qualityMap1)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->qualityMap1)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->qualityMap1)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->qualityMap2)._M_h._M_buckets = &(this->qualityMap2)._M_h._M_single_bucket;
  (this->qualityMap2)._M_h._M_bucket_count = 1;
  (this->qualityMap2)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->qualityMap2)._M_h._M_element_count = 0;
  (this->qualityMap2)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->qualityMap2)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->qualityMap2)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->observedChroma1)._M_h._M_buckets = &(this->observedChroma1)._M_h._M_single_bucket;
  (this->observedChroma1)._M_h._M_bucket_count = 1;
  (this->observedChroma1)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->observedChroma1)._M_h._M_element_count = 0;
  (this->observedChroma1)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->observedChroma1)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->observedChroma1)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->observedChroma2)._M_h._M_buckets = &(this->observedChroma2)._M_h._M_single_bucket;
  (this->observedChroma2)._M_h._M_bucket_count = 1;
  (this->observedChroma2)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->observedChroma2)._M_h._M_element_count = 0;
  (this->observedChroma2)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->observedChroma2)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->observedChroma2)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->CProb)._M_h._M_buckets = &(this->CProb)._M_h._M_single_bucket;
  (this->CProb)._M_h._M_bucket_count = 1;
  (this->CProb)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->CProb)._M_h._M_element_count = 0;
  (this->CProb)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->CProb)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->CProb)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->OProb)._M_h._M_buckets = &(this->OProb)._M_h._M_single_bucket;
  (this->OProb)._M_h._M_bucket_count = 1;
  (this->OProb)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->OProb)._M_h._M_element_count = 0;
  (this->OProb)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->OProb)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->OProb)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->code1)._M_dataplus._M_p = (pointer)&(this->code1).field_2;
  (this->code1)._M_string_length = 0;
  (this->code1).field_2._M_local_buf[0] = '\0';
  (this->qual1)._M_dataplus._M_p = (pointer)&(this->qual1).field_2;
  (this->qual1)._M_string_length = 0;
  (this->qual1).field_2._M_local_buf[0] = '\0';
  (this->code2)._M_dataplus._M_p = (pointer)&(this->code2).field_2;
  (this->code2)._M_string_length = 0;
  (this->code2).field_2._M_local_buf[0] = '\0';
  (this->qual2)._M_dataplus._M_p = (pointer)&(this->qual2).field_2;
  (this->qual2)._M_string_length = 0;
  (this->qual2).field_2._M_local_buf[0] = '\0';
  std::
  _Hashtable<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::operator=((_Hashtable<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               *)this,&switchRate->_M_h);
  std::__cxx11::string::_M_assign((string *)&this->code1);
  std::__cxx11::string::_M_assign((string *)&this->code2);
  std::__cxx11::string::_M_assign((string *)&this->qual1);
  std::__cxx11::string::_M_assign((string *)&this->qual2);
  this->minGCPositions = minGCPositions;
  return;
}

Assistant:

hmm::hmm(std::unordered_map<int, double> switchRate,string code1, string qual1, string code2, string qual2,int minGCPositions){
    this->switchRateMap = switchRate;
    this->code1 = code1;
    this->code2 = code2;
    this-> qual1 = qual1;
    this-> qual2 = qual2;
    this->minGCPositions = minGCPositions;
}